

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NetStrengthSyntax*,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,NetStrengthSyntax **args_2,Token *args_3,DataTypeSyntax *args_4,
          TimingControlSyntax **args_5,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_6,
          Token *args_7)

{
  Token semi;
  Token netType;
  Token expansionHint;
  NetDeclarationSyntax *pNVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  TimingControlSyntax *unaff_RBX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  NetDeclarationSyntax *in_R9;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *unaff_R14;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  
  pNVar1 = (NetDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  netType.info = in_RCX;
  netType.kind = (short)in_R8;
  netType._2_1_ = (char)((ulong)in_R8 >> 0x10);
  netType.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  netType.rawLen = (int)((ulong)in_R8 >> 0x20);
  expansionHint.info = in_RDI;
  expansionHint.kind = (short)in_RSI;
  expansionHint._2_1_ = (char)((ulong)in_RSI >> 0x10);
  expansionHint.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  expansionHint.rawLen = (int)((ulong)in_RSI >> 0x20);
  semi.info = in_stack_00000008;
  semi.kind = (short)unaff_retaddr;
  semi._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  semi.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  semi.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDX[1],netType,
             (NetStrengthSyntax *)*in_RDX,expansionHint,*(DataTypeSyntax **)(in_R8 + 8),unaff_RBX,
             unaff_R14,semi);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }